

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# theory_data.cpp
# Opt level: O0

void __thiscall Potassco::TheoryData::Data::Data(Data *this)

{
  RawStack<Potassco::TheoryAtom_*> *in_RDI;
  
  RawStack<Potassco::TheoryAtom_*>::RawStack(in_RDI);
  RawStack<Potassco::TheoryElement_*>::RawStack((RawStack<Potassco::TheoryElement_*> *)in_RDI);
  RawStack<Potassco::TheoryTerm>::RawStack((RawStack<Potassco::TheoryTerm> *)in_RDI);
  Up::Up((Up *)((RawStack<Potassco::TheoryTerm> *)in_RDI + 3));
  return;
}

Assistant:

RawStack() : top(0) {}